

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall TcpSocketImpl::ConnectThread(TcpSocketImpl *this)

{
  atomic_uchar *paVar1;
  BaseSocket *pBVar2;
  uint __i;
  int iVar3;
  long lVar4;
  ulong uVar5;
  TcpSocket *__args;
  char cVar6;
  bool bVar7;
  TcpSocketImpl *local_168;
  thread local_160;
  socklen_t iLen;
  undefined4 uStack_154;
  undefined8 local_150;
  timeval local_148;
  fd_set errorfd;
  fd_set writefd;
  
  LOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  (paVar1->super___atomic_base<unsigned_char>)._M_i =
       (paVar1->super___atomic_base<unsigned_char>)._M_i & 0xfb;
  UNLOCK();
  cVar6 = (this->super_BaseSocketImpl).m_bStop;
  do {
    do {
      if (cVar6 != '\0') goto LAB_0011644b;
      writefd.fds_bits[0xe] = 0;
      writefd.fds_bits[0xf] = 0;
      writefd.fds_bits[0xc] = 0;
      writefd.fds_bits[0xd] = 0;
      writefd.fds_bits[10] = 0;
      writefd.fds_bits[0xb] = 0;
      writefd.fds_bits[8] = 0;
      writefd.fds_bits[9] = 0;
      writefd.fds_bits[6] = 0;
      writefd.fds_bits[7] = 0;
      writefd.fds_bits[4] = 0;
      writefd.fds_bits[5] = 0;
      writefd.fds_bits[2] = 0;
      writefd.fds_bits[3] = 0;
      writefd.fds_bits[0] = 0;
      writefd.fds_bits[1] = 0;
      errorfd.fds_bits[0xe] = 0;
      errorfd.fds_bits[0xf] = 0;
      errorfd.fds_bits[0xc] = 0;
      errorfd.fds_bits[0xd] = 0;
      errorfd.fds_bits[10] = 0;
      errorfd.fds_bits[0xb] = 0;
      errorfd.fds_bits[8] = 0;
      errorfd.fds_bits[9] = 0;
      errorfd.fds_bits[6] = 0;
      errorfd.fds_bits[7] = 0;
      errorfd.fds_bits[4] = 0;
      errorfd.fds_bits[5] = 0;
      errorfd.fds_bits[2] = 0;
      errorfd.fds_bits[3] = 0;
      errorfd.fds_bits[0] = 0;
      errorfd.fds_bits[1] = 0;
      local_148.tv_sec = 2;
      local_148.tv_usec = 0;
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        writefd.fds_bits[lVar4] = 0;
      }
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        errorfd.fds_bits[lVar4] = 0;
      }
      iVar3 = (this->super_BaseSocketImpl).m_fSock;
      uVar5 = 1L << ((byte)iVar3 & 0x3f);
      writefd.fds_bits[iVar3 / 0x40] = writefd.fds_bits[iVar3 / 0x40] | uVar5;
      errorfd.fds_bits[iVar3 / 0x40] = errorfd.fds_bits[iVar3 / 0x40] | uVar5;
      iVar3 = select(iVar3 + 1,(fd_set *)0x0,(fd_set *)&writefd,(fd_set *)&errorfd,&local_148);
      cVar6 = (this->super_BaseSocketImpl).m_bStop;
    } while ((bool)cVar6 != false || iVar3 < 1);
    iVar3 = (this->super_BaseSocketImpl).m_fSock;
    if (((ulong)errorfd.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0) {
      _iLen = (code *)CONCAT44(uStack_154,4);
      getsockopt(iVar3,1,4,&(this->super_BaseSocketImpl).m_iError,&iLen);
      (this->super_BaseSocketImpl).m_iErrLoc = 9;
      LOCK();
      (this->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>._M_i = '\x0f'
      ;
      UNLOCK();
      bVar7 = (this->super_BaseSocketImpl).m_bStop;
      if (bVar7 == false &&
          (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
          (_Manager_type)0x0) {
        std::function<void_(BaseSocket_*,_void_*)>::operator()
                  (&(this->super_BaseSocketImpl).m_fErrorParam,(this->super_BaseSocketImpl).m_pBkRef
                   ,(this->super_BaseSocketImpl).m_pvUserData);
      }
      else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
               (_Manager_type)0x0 && bVar7 == false) {
        std::function<void_(BaseSocket_*)>::operator()
                  (&(this->super_BaseSocketImpl).m_fError,(this->super_BaseSocketImpl).m_pBkRef);
      }
      goto LAB_0011644b;
    }
  } while ((writefd.fds_bits[iVar3 / 0x40] & 1L << ((byte)((long)iVar3 % 0x40) & 0x3f)) == 0);
  GetConnectionInfo(this);
  _iLen = SelectThread;
  local_150 = 0;
  local_168 = this;
  std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
            (&local_160,(type *)&iLen,&local_168);
  std::thread::operator=(&(this->super_BaseSocketImpl).m_thListen,&local_160);
  std::thread::~thread(&local_160);
  _iLen = WriteThread;
  local_150 = 0;
  local_168 = this;
  std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
            (&local_160,(type *)&iLen,&local_168);
  std::thread::operator=(&(this->super_BaseSocketImpl).m_thWrite,&local_160);
  std::thread::~thread(&local_160);
  pBVar2 = (this->super_BaseSocketImpl).m_pBkRef;
  if (pBVar2 == (BaseSocket *)0x0) {
    __args = (TcpSocket *)0x0;
  }
  else {
    __args = (TcpSocket *)__dynamic_cast(pBVar2,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
  }
  if (__args == (TcpSocket *)0x0 ||
      (this->m_fClientConnectedParam).super__Function_base._M_manager == (_Manager_type)0x0) {
    if ((this->m_fClientConnected).super__Function_base._M_manager != (_Manager_type)0x0 &&
        __args != (TcpSocket *)0x0) {
      std::function<void_(TcpSocket_*)>::operator()(&this->m_fClientConnected,__args);
    }
  }
  else {
    std::function<void_(TcpSocket_*,_void_*)>::operator()
              (&this->m_fClientConnectedParam,__args,(this->super_BaseSocketImpl).m_pvUserData);
  }
  if ((this->m_fClientConnectedSsl).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(TcpSocketImpl_*)>::operator()
              (&this->m_fClientConnectedSsl,(TcpSocketImpl *)0x0);
  }
LAB_0011644b:
  LOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  (paVar1->super___atomic_base<unsigned_char>)._M_i =
       (paVar1->super___atomic_base<unsigned_char>)._M_i | 4;
  UNLOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  LOCK();
  bVar7 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\a';
  if (bVar7) {
    (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x0f';
  }
  UNLOCK();
  if (bVar7) {
    iVar3 = (this->super_BaseSocketImpl).m_fSock;
    if (iVar3 != -1) {
      close(iVar3);
      (this->super_BaseSocketImpl).m_fSock = -1;
    }
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
    if (this->m_bSelfDelete == true) {
      (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x16])(this);
    }
  }
  return;
}

Assistant:

void TcpSocketImpl::ConnectThread()
{
    m_iShutDownState &= static_cast<uint8_t>(~4);

    while (m_bStop == false)
    {
        fd_set writefd{}, errorfd{};
        struct timeval timeout{};

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&writefd);
        FD_ZERO(&errorfd);

        FD_SET(m_fSock, &writefd);
        FD_SET(m_fSock, &errorfd);

        if (::select(static_cast<int>(m_fSock + 1), nullptr, &writefd, &errorfd, &timeout) > 0 && m_bStop == false)
        {
            if (FD_ISSET(m_fSock, &errorfd))
            {
                socklen_t iLen = sizeof(m_iError);
                getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                m_iErrLoc = 9;
                m_iShutDownState = 15;
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                break;
            }

            if (FD_ISSET(m_fSock, &writefd))
            {
                GetConnectionInfo();

                m_thListen = thread(&TcpSocketImpl::SelectThread, this);
                m_thWrite = thread(&TcpSocketImpl::WriteThread, this);

                TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                if (m_fClientConnectedParam && pTcpSocket != nullptr)
                    m_fClientConnectedParam(pTcpSocket, m_pvUserData);
                else if (m_fClientConnected && pTcpSocket != nullptr)
                    m_fClientConnected(pTcpSocket);

                if (m_fClientConnectedSsl)
                    m_fClientConnectedSsl(nullptr);
                break;
            }
        }
    }

    m_iShutDownState |= 4;

    unsigned char cExpected = 7;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }

        StartClosingCB();

        if (m_bSelfDelete == true)    // Auto-delete, socket created from server socket
            Delete();// thread([&]() { delete this; }).detach();
    }
}